

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FutureStd.cpp
# Opt level: O2

void testFutureStd(int iterations)

{
  int iVar1;
  long lVar2;
  long lVar3;
  code *local_48;
  future<long> future;
  
  lVar3 = 0;
  for (iVar1 = 0; iVar1 < iterations; iVar1 = iVar1 + 1) {
    local_48 = testFutureStd::A::testProc;
    std::async<long(*)(long),int&>((_func_long_long **)&future,(int *)&local_48);
    lVar2 = std::future<long>::get(&future);
    lVar3 = lVar3 + lVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&future.super___basic_future<long>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  if (lVar3 == ((long)(iterations + -1) * (long)iterations) / 2) {
    return;
  }
  puts("fail");
  std::terminate();
}

Assistant:

void testFutureStd(int iterations)
{
  struct A
  {
    static int64_t testProc(int64_t i)
    {
      return i;
    }
  };

  int64_t result = 0;
  for(int i = 0; i < iterations; ++i)
  {
    std::future<int64_t> future = std::async(&A::testProc, i);
    result += future.get();
  }
  if(result != (int64_t)iterations * (int64_t)(iterations - 1) / 2)
  {
    printf("fail\n");
    std::terminate();
  }
}